

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O2

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::knn_search
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *queries,Matrix<unsigned_int> *indices
          ,Matrix<float> *dists,size_t_conflict knn,Search_Params *params)

{
  ostream *poVar1;
  time_t tVar2;
  int i;
  uint uVar3;
  char *__assertion;
  
  if (queries->cols == this->vec_len) {
    if (indices->rows < queries->rows) {
      __assertion = "indices.rows>=queries.rows";
      uVar3 = 0x5b;
    }
    else if (dists->rows < queries->rows) {
      __assertion = "dists.rows>=queries.rows";
      uVar3 = 0x5c;
    }
    else if (indices->cols < knn) {
      __assertion = "indices.cols>=knn";
      uVar3 = 0x5d;
    }
    else {
      if (knn <= dists->cols) {
        if ((ulong)this->k < params->E) {
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)"
                                  );
          std::endl<char,std::char_traits<char>>(poVar1);
          poVar1 = std::operator<<((ostream *)&std::cout,"WARNINGS: The procedure will use k(");
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          poVar1 = std::operator<<(poVar1,")");
          poVar1 = std::operator<<(poVar1," as the search expand.");
          std::endl<char,std::char_traits<char>>(poVar1);
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k."
                                  );
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        tVar2 = time((time_t *)0x0);
        srand((uint)tVar2);
        for (uVar3 = 0; uVar3 < queries->rows; uVar3 = uVar3 + 1) {
          find_neighbors(this,queries->data + queries->cols * uVar3,
                         indices->data + indices->cols * uVar3,dists->data + dists->cols * uVar3,knn
                         ,params);
        }
        return;
      }
      __assertion = "dists.cols>=knn";
      uVar3 = 0x5e;
    }
  }
  else {
    __assertion = "queries.cols==vec_len";
    uVar3 = 0x5a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Kejie-Wang[P]gnns/algorithms/gnns_index.h"
                ,uVar3,
                "void gnns::Gnns_Index<L2Distance<float>>::knn_search(const Matrix<ElementType> &, Matrix<IndexType> &, Matrix<DistanceType>, size_t, const Search_Params &) [Distance = L2Distance<float>]"
               );
}

Assistant:

void knn_search(const Matrix<ElementType>& queries,
            Matrix<IndexType>& indices,
            Matrix<DistanceType> dists,
            size_t knn,
            const Search_Params& params)
        {
            //assert the vector in same dim
            assert(queries.cols==vec_len);
            assert(indices.rows>=queries.rows);
            assert(dists.rows>=queries.rows);
            assert(indices.cols>=knn);
            assert(dists.cols>=knn);

            if(params.E > k)
            {
                std::cout << "WARNINGS: The search expand E in param exceeds the k (param of the build knn graph)" << std::endl;
                std::cout << "WARNINGS: The procedure will use k(" << k << ")" << " as the search expand." << std::endl;
                std::cout << "WARNINGS: For using a larger search expand, you can rebuild the graph with a larger k." << std::endl;
            }
            srand((unsigned)time(0));
            //for each query
            for(int i=0;i<queries.rows;++i)
            {
                // std::cout << i << std::endl;
                find_neighbors(queries[i], indices[i], dists[i], knn, params);
            }
        }